

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<double>_>::SolveJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,TPZFMatrix<Fad<double>_> *F,
          TPZFMatrix<Fad<double>_> *result,TPZFMatrix<Fad<double>_> *residual,
          TPZFMatrix<Fad<double>_> *scratch,REAL *tol,int FromCurrent)

{
  int iVar1;
  int extraout_var;
  long lVar2;
  long lVar3;
  Fad<double> *pFVar4;
  long lVar5;
  long row;
  long col;
  double dVar6;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> local_60;
  Fad<double> local_50;
  
  if (FromCurrent == 0) {
    TPZFMatrix<Fad<double>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  dVar6 = Norm(scratch);
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar5 = 0;
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
    lVar2 = lVar5;
  }
  lVar3 = (F->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (lVar3 < 1) {
    lVar3 = lVar5;
  }
  while ((lVar5 < *numiterations && (*tol <= ABS(dVar6) && ABS(dVar6) != *tol))) {
    for (col = 0; col != lVar3; col = col + 1) {
      for (row = 0; lVar2 != row; row = row + 1) {
        pFVar4 = TPZFMatrix<Fad<double>_>::operator()(scratch,row,col);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,row,row);
        local_60.fadexpr_.left_ = pFVar4;
        local_60.fadexpr_.right_ = &local_50;
        pFVar4 = TPZFMatrix<Fad<double>_>::operator()(result,row,col);
        Fad<double>::operator+=(pFVar4,&local_60);
        Fad<double>::~Fad(&local_50);
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
    dVar6 = Norm(scratch);
    lVar5 = lVar5 + 1;
  }
  if (residual != (TPZFMatrix<Fad<double>_> *)0x0) {
    TPZFMatrix<Fad<double>_>::operator=(residual,scratch);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}